

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)

{
  int iVar1;
  int rc;
  int bResetKvEngine_local;
  Pager *pPager_local;
  
  if (pPager->iState < 2) {
    pPager_local._4_4_ = 0;
  }
  else if (pPager->is_mem == 0) {
    if (pPager->is_rdonly == 0) {
      if (pPager->iState < 3) {
        pager_unlock_db(pPager,1);
        pPager->iState = 1;
      }
      else {
        if (pPager->no_jrnl == 0) {
          if (pPager->pjfd != (unqlite_file *)0x0) {
            unqliteOsSync(pPager->pjfd,2);
          }
          unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
          pPager->pjfd = (unqlite_file *)0x0;
          if (((pPager->iFlags & 3U) != 0) && (iVar1 = pager_journal_rollback(pPager,0), iVar1 != 0)
             ) {
            pPager->pDb->iFlags = pPager->pDb->iFlags | 1;
            return iVar1;
          }
        }
        unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
        iVar1 = pager_reset_state(pPager,bResetKvEngine);
        if (iVar1 != 0) {
          pPager->pDb->iFlags = pPager->pDb->iFlags | 1;
          unqliteGenError(pPager->pDb,"Error while reseting pager to its initial state");
          return iVar1;
        }
      }
      pPager_local._4_4_ = 0;
    }
    else {
      unqliteGenError(pPager->pDb,"Read-Only database");
      pPager_local._4_4_ = -0x4b;
    }
  }
  else {
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)
{
	int rc = UNQLITE_OK;
	if( pPager->iState < PAGER_WRITER_LOCKED ){
		/* A write transaction must be opened */
		return UNQLITE_OK;
	}
	if( pPager->is_mem ){
		/* As of this release 1.1.6: Transactions are not supported for in-memory databases */
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		/* Read-Only DB */
		unqliteGenError(pPager->pDb,"Read-Only database");
		return UNQLITE_READ_ONLY;
	}
	if( pPager->iState >= PAGER_WRITER_CACHEMOD ){
		if( !pPager->no_jrnl ){
			/* Close any outstanding joural file */
			if( pPager->pjfd ){
				/* Sync the journal file */
				unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
			}
			unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
			pPager->pjfd = 0;
			if( pPager->iFlags & (PAGER_CTRL_COMMIT_ERR|PAGER_CTRL_DIRTY_COMMIT) ){
				/* Perform the rollback */
				rc = pager_journal_rollback(pPager,0);
				if( rc != UNQLITE_OK ){
					/* Set the auto-commit flag */
					pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT;
					return rc;
				}
			}
		}
		/* Unlink the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
		/* Reset the pager state */
		rc = pager_reset_state(pPager,bResetKvEngine);
		if( rc != UNQLITE_OK ){
			/* Mostly an unlikely scenario */
			pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT; /* Set the auto-commit flag */
			unqliteGenError(pPager->pDb,"Error while reseting pager to its initial state");
			return rc;
		}
	}else{
		/* Downgrade to shared lock */
		pager_unlock_db(pPager,SHARED_LOCK);
		pPager->iState = PAGER_READER;
	}
	return UNQLITE_OK;
}